

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O2

void anon_unknown.dwarf_7f0079::RecordProcesses
               (TIntermediate *intermediate,EShMessages messages,string *sourceEntryPointName)

{
  allocator<char> local_41;
  value_type local_40;
  
  if ((messages & EShMsgRelaxedErrors) != EShMsgDefault) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"relaxed-errors",&local_41);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(intermediate->processes).processes,&local_40);
    std::__cxx11::string::_M_dispose();
  }
  if ((messages & EShMsgSuppressWarnings) != EShMsgDefault) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"suppress-warnings",&local_41);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(intermediate->processes).processes,&local_40);
    std::__cxx11::string::_M_dispose();
  }
  if ((messages >> 8 & 1) != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"keep-uncalled",&local_41);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(intermediate->processes).processes,&local_40);
    std::__cxx11::string::_M_dispose();
  }
  if (sourceEntryPointName->_M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"source-entrypoint",&local_41);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(intermediate->processes).processes,&local_40);
    std::__cxx11::string::_M_dispose();
    glslang::TProcesses::addArgument(&intermediate->processes,sourceEntryPointName);
  }
  return;
}

Assistant:

void RecordProcesses(TIntermediate& intermediate, EShMessages messages, const std::string& sourceEntryPointName)
{
    if ((messages & EShMsgRelaxedErrors) != 0)
        intermediate.addProcess("relaxed-errors");
    if ((messages & EShMsgSuppressWarnings) != 0)
        intermediate.addProcess("suppress-warnings");
    if ((messages & EShMsgKeepUncalled) != 0)
        intermediate.addProcess("keep-uncalled");
    if (sourceEntryPointName.size() > 0) {
        intermediate.addProcess("source-entrypoint");
        intermediate.addProcessArgument(sourceEntryPointName);
    }
}